

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::record_compute_pipeline
          (StateRecorder *this,VkPipeline pipeline,VkComputePipelineCreateInfo *create_info,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,Hash custom_hash,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)

{
  Impl *this_00;
  bool bVar1;
  VkPipelineBinaryInfoKHR *pVVar2;
  WorkItem local_88;
  int local_64;
  VkComputePipelineCreateInfo *local_60;
  VkComputePipelineCreateInfo *new_info;
  lock_guard<std::mutex> lock_1;
  lock_guard<std::mutex> lock;
  VkPipelineBinaryInfoKHR *binaries;
  Hash custom_hash_local;
  uint32_t base_pipeline_count_local;
  VkPipeline *base_pipelines_local;
  VkComputePipelineCreateInfo *create_info_local;
  VkPipeline pipeline_local;
  StateRecorder *this_local;
  
  pVVar2 = find_pnext<VkPipelineBinaryInfoKHR>
                     (VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR,create_info->pNext);
  if ((pVVar2 == (VkPipelineBinaryInfoKHR *)0x0) || (pVVar2->binaryCount == 0)) {
    bVar1 = shader_stage_is_identifier_only(&create_info->stage);
    if ((bVar1) && ((this->impl->should_record_identifier_only & 1U) == 0)) {
      std::lock_guard<std::mutex>::lock_guard(&lock_1,&this->impl->record_lock);
      if (pipeline != (VkPipeline)0x0) {
        Impl::push_unregister_locked<VkPipeline_T*>
                  (this->impl,VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,pipeline);
      }
      this_local._7_1_ = 1;
      std::lock_guard<std::mutex>::~lock_guard(&lock_1);
    }
    else {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)&new_info,&this->impl->record_lock);
      local_60 = (VkComputePipelineCreateInfo *)0x0;
      bVar1 = Impl::copy_compute_pipeline
                        (this->impl,create_info,&this->impl->temp_allocator,base_pipelines,
                         base_pipeline_count,device,gsmcii,&local_60);
      if (bVar1) {
        this_00 = this->impl;
        local_88.type = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
        local_88.handle = api_object_cast<unsigned_long,VkPipeline_T*>(pipeline);
        local_88.create_info = local_60;
        local_88.custom_hash = custom_hash;
        Impl::push_work_locked(this_00,&local_88);
        local_64 = 0;
      }
      else {
        if (pipeline != (VkPipeline)0x0) {
          Impl::push_unregister_locked<VkPipeline_T*>
                    (this->impl,VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,pipeline);
        }
        this_local._7_1_ = 0;
        local_64 = 1;
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&new_info);
      if (local_64 == 0) {
        Impl::pump_synchronized_recording(this->impl,this);
        this_local._7_1_ = 1;
      }
    }
  }
  else {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StateRecorder::record_compute_pipeline(VkPipeline pipeline, const VkComputePipelineCreateInfo &create_info,
                                            const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                            Hash custom_hash,
                                            VkDevice device,
                                            PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)
{
	// Silently ignore if we have pipeline binaries.
	// We have no way of recording these unless we go the extra mile to
	// override the global key and add extra metadata blocks.
	// Hopefully applications are well-behaved ...
	auto *binaries = find_pnext<VkPipelineBinaryInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR, create_info.pNext);
	if (binaries && binaries->binaryCount)
		return true;

	// Ignore pipelines that cannot result in meaningful replay.
	// If we are using module identifier data + on use, we need to push it for record.
	if (shader_stage_is_identifier_only(create_info.stage) &&
	    !impl->should_record_identifier_only)
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);
		// Have to forget any reference if this API handle is recycled.
		if (pipeline != VK_NULL_HANDLE)
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO, pipeline);
		return true;
	}

	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkComputePipelineCreateInfo *new_info = nullptr;
		if (!impl->copy_compute_pipeline(&create_info, impl->temp_allocator,
		                                 base_pipelines, base_pipeline_count,
		                                 device, gsmcii,
		                                 &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			if (pipeline != VK_NULL_HANDLE)
				impl->push_unregister_locked(VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO, pipeline);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO, api_object_cast<uint64_t>(pipeline),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}